

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  local_iterator it;
  local_iterator it_00;
  local_iterator it_01;
  local_iterator it_02;
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  long in_RDI;
  AssertionResult gtest_ar__2;
  const_local_iterator e2;
  const_local_iterator b2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  const_local_iterator e;
  const_local_iterator b;
  size_type bucknum;
  key_type *in_stack_fffffffffffffd68;
  bool *success;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd70;
  const_local_iterator *this_02;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd78;
  char *message;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  undefined4 uVar3;
  Type type;
  undefined1 *i;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  value_type *in_stack_fffffffffffffde8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffdf0;
  bool *local_208;
  const_local_iterator *local_200;
  char *local_1f0;
  const_iterator local_1e8;
  const_local_iterator *local_1c0;
  undefined8 local_1b0;
  dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_1a8;
  string local_188 [55];
  undefined1 local_151;
  AssertionResult local_150 [2];
  string local_128 [55];
  undefined1 local_f1;
  AssertionResult local_f0;
  bool *local_e0;
  const_local_iterator *local_d8;
  char *local_c8;
  const_iterator local_c0;
  const_local_iterator *local_98;
  undefined8 local_88;
  dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_80;
  key_type local_60;
  size_type local_58;
  undefined1 local_18 [24];
  
  uVar3 = (undefined4)in_RDI;
  type = (Type)((ulong)in_RDI >> 0x20);
  this_00 = (AssertHelper *)(in_RDI + 0x10);
  i = local_18;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffffd78,(int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffffdf0._M_head_impl,in_stack_fffffffffffffde8);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xaed925);
  this_01 = (HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)(CONCAT44(type,uVar3) + 0x10);
  local_60 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(this_01,in_stack_fffffffffffffd8c);
  local_58 = google::
             BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffdb0,(size_type)i);
  it.super_local_iterator.pos._0_4_ = in_stack_fffffffffffffd88;
  it.super_local_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_88;
  it.super_local_iterator.pos._4_4_ = in_stack_fffffffffffffd8c;
  it.super_local_iterator.end = (pointer)this_01;
  it.parent_._0_4_ = uVar3;
  it.parent_._4_4_ = type;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(local_98,it);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffdb0,(size_type)i);
  it_00.super_local_iterator.pos._0_4_ = in_stack_fffffffffffffd88;
  it_00.super_local_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_c8;
  it_00.super_local_iterator.pos._4_4_ = in_stack_fffffffffffffd8c;
  it_00.super_local_iterator.end = (pointer)this_01;
  it_00.parent_._0_4_ = uVar3;
  it_00.parent_._4_4_ = type;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(local_d8,it_00);
  local_f1 = google::
             dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             ::operator!=(&local_80,&local_c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d8,local_e0,(type *)0xaeda43);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  success = local_e0;
  this_02 = local_d8;
  message = local_c8;
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffffde8,
               (char *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)this_01,in_stack_fffffffffffffd8c,local_c8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffdf0._M_head_impl,
               (Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    std::__cxx11::string::~string(local_128);
    testing::Message::~Message((Message *)0xaedb2a);
    success = local_e0;
    this_02 = local_d8;
    message = local_c8;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xaedbbe);
  google::
  dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++(&this_02->super_const_local_iterator,(int)((ulong)success >> 0x20));
  local_151 = google::
              dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_80,&local_c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,success,(type *)0xaedc0c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffffde8,
               (char *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)this_01,in_stack_fffffffffffffd8c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffdf0._M_head_impl,
               (Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_188);
    testing::Message::~Message((Message *)0xaedcdf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xaedd76);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffdb0,(size_type)i);
  it_01.super_local_iterator.pos._0_4_ = in_stack_fffffffffffffd88;
  it_01.super_local_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_1b0;
  it_01.super_local_iterator.pos._4_4_ = in_stack_fffffffffffffd8c;
  it_01.super_local_iterator.end = (pointer)this_01;
  it_01.parent_._0_4_ = uVar3;
  it_01.parent_._4_4_ = type;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(local_1c0,it_01);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffdb0,(size_type)i);
  it_02.super_local_iterator.pos._0_4_ = in_stack_fffffffffffffd88;
  it_02.super_local_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_1f0;
  it_02.super_local_iterator.pos._4_4_ = in_stack_fffffffffffffd8c;
  it_02.super_local_iterator.end = (pointer)this_01;
  it_02.parent_._0_4_ = uVar3;
  it_02.parent_._4_4_ = type;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(local_200,it_02);
  uVar2 = google::
          dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_1a8,&local_1e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_200,local_208,(type *)0xaede59);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffde8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffffde8,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8,
               in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)this_01,in_stack_fffffffffffffd8c,local_1f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffdf0._M_head_impl,
               (Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_200);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
    testing::Message::~Message((Message *)0xaedf11);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xaedf96);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ConstLocalIterators) {
  this->ht_.insert(this->UniqueObject(1));
  const typename TypeParam::size_type bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  typename TypeParam::const_local_iterator b = this->ht_.begin(bucknum);
  typename TypeParam::const_local_iterator e = this->ht_.end(bucknum);
  EXPECT_TRUE(b != e);
  b++;
  EXPECT_TRUE(b == e);
  typename TypeParam::const_local_iterator b2 = this->ht_.begin(bucknum ^ 1);
  typename TypeParam::const_local_iterator e2 = this->ht_.end(bucknum ^ 1);
  EXPECT_TRUE(b2 == e2);
}